

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demo.cpp
# Opt level: O0

int main(void)

{
  _Invoker_type *this;
  proto callback;
  void *pvVar1;
  proto p_Var2;
  ostream *poVar3;
  proto callback_00;
  undefined1 local_a8 [8];
  funcptr<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_codehz[P]funcptr_demo_cpp:37:26),_void>
  another_lambda;
  undefined1 local_80 [8];
  funcptr<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_codehz[P]funcptr_demo_cpp:32:18),_void>
  lambda;
  int binding;
  input local_50;
  undefined1 local_30 [8];
  funcptr<std::function<void_(int,_func_ptr::user_pointer)>,_void> fnobj;
  funcptr<void_(*)(int,_func_ptr::user_pointer),_void> fn;
  
  this = &fnobj.storage._M_invoker;
  func_ptr::funcptr<void_(*)(int,_func_ptr::user_pointer),_void>::funcptr
            ((funcptr<void_(*)(int,_func_ptr::user_pointer),_void> *)this,test);
  callback = func_ptr::funcptr::operator_cast_to_function_pointer((funcptr *)this);
  pvVar1 = func_ptr::funcptr<void_(*)(int,_func_ptr::user_pointer),_void>::holder
                     ((funcptr<void_(*)(int,_func_ptr::user_pointer),_void> *)this);
  fake_clib_func((_func_void_int_void_ptr *)callback,pvVar1);
  std::function<void(int,func_ptr::user_pointer)>::
  function<void(&)(int,func_ptr::user_pointer),void>
            ((function<void(int,func_ptr::user_pointer)> *)&local_50,test);
  func_ptr::funcptr<std::function<void_(int,_func_ptr::user_pointer)>,_void>::funcptr
            ((funcptr<std::function<void_(int,_func_ptr::user_pointer)>,_void> *)local_30,&local_50)
  ;
  std::function<void_(int,_func_ptr::user_pointer)>::~function(&local_50);
  p_Var2 = func_ptr::funcptr::operator_cast_to_function_pointer((funcptr *)local_30);
  pvVar1 = func_ptr::funcptr<std::function<void_(int,_func_ptr::user_pointer)>,_void>::holder
                     ((funcptr<std::function<void_(int,_func_ptr::user_pointer)>,_void> *)local_30);
  fake_clib_func((_func_void_int_void_ptr *)p_Var2,pvVar1);
  another_lambda.super_funcptr<std::function<void_(func_ptr::user_pointer,_int)>,_void>.storage.
  _M_invoker = (_Invoker_type)
               &lambda.super_funcptr<std::function<void_(int,_func_ptr::user_pointer)>,_void>.
                storage._M_invoker;
  func_ptr::
  funcptr<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/codehz[P]funcptr/demo.cpp:32:18),_void>
  ::funcptr((funcptr<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_codehz[P]funcptr_demo_cpp:32:18),_void>
             *)local_80,
            (anon_class_8_1_7ce6e165)
            another_lambda.super_funcptr<std::function<void_(func_ptr::user_pointer,_int)>,_void>.
            storage._M_invoker);
  p_Var2 = func_ptr::funcptr::operator_cast_to_function_pointer((funcptr *)local_80);
  pvVar1 = func_ptr::funcptr<std::function<void_(int,_func_ptr::user_pointer)>,_void>::holder
                     ((funcptr<std::function<void_(int,_func_ptr::user_pointer)>,_void> *)local_80);
  fake_clib_func((_func_void_int_void_ptr *)p_Var2,pvVar1);
  poVar3 = std::operator<<((ostream *)&std::cout,"[main] got ");
  poVar3 = (ostream *)
           std::ostream::operator<<
                     (poVar3,(int)lambda.
                                  super_funcptr<std::function<void_(int,_func_ptr::user_pointer)>,_void>
                                  .storage._M_invoker);
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  func_ptr::
  funcptr<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/codehz[P]funcptr/demo.cpp:37:26),_void>
  ::funcptr((funcptr<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_codehz[P]funcptr_demo_cpp:37:26),_void>
             *)local_a8,
            (anon_class_8_1_7ce6e165)
            &lambda.super_funcptr<std::function<void_(int,_func_ptr::user_pointer)>,_void>.storage.
             _M_invoker);
  callback_00 = func_ptr::funcptr::operator_cast_to_function_pointer((funcptr *)local_a8);
  pvVar1 = func_ptr::funcptr<std::function<void_(func_ptr::user_pointer,_int)>,_void>::holder
                     ((funcptr<std::function<void_(func_ptr::user_pointer,_int)>,_void> *)local_a8);
  another_clib_func((_func_void_void_ptr_int *)callback_00,pvVar1);
  poVar3 = std::operator<<((ostream *)&std::cout,"[main] got ");
  poVar3 = (ostream *)
           std::ostream::operator<<
                     (poVar3,(int)lambda.
                                  super_funcptr<std::function<void_(int,_func_ptr::user_pointer)>,_void>
                                  .storage._M_invoker);
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  func_ptr::
  funcptr<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/codehz[P]funcptr/demo.cpp:37:26),_void>
  ::~funcptr((funcptr<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_codehz[P]funcptr_demo_cpp:37:26),_void>
              *)local_a8);
  func_ptr::
  funcptr<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/codehz[P]funcptr/demo.cpp:32:18),_void>
  ::~funcptr((funcptr<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_codehz[P]funcptr_demo_cpp:32:18),_void>
              *)local_80);
  func_ptr::funcptr<std::function<void_(int,_func_ptr::user_pointer)>,_void>::~funcptr
            ((funcptr<std::function<void_(int,_func_ptr::user_pointer)>,_void> *)local_30);
  return 0;
}

Assistant:

int main() {
  funcptr fn{test};
  fake_clib_func(fn, fn.holder());

  funcptr fnobj{std::function<void(int, user_pointer)>{test}};
  fake_clib_func(fnobj, fnobj.holder());

  int binding;

  funcptr lambda{[&](int input, user_pointer) { binding = input; }};
  fake_clib_func(lambda, lambda.holder());

  std::cout << "[main] got " << binding << std::endl;

  funcptr another_lambda{[&](user_pointer, int input) { binding = input; }};
  another_clib_func(another_lambda, another_lambda.holder());

  std::cout << "[main] got " << binding << std::endl;
}